

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerApp::GetExtendedPanId
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aExtendedPanId)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  writer write;
  string extendedPanIdString;
  string local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  writer local_b8;
  ErrorCode local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  local_c0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_c0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_80 = 0;
  local_78[0] = 0;
  local_88 = local_78;
  iVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])(this);
  if ((char)iVar2 == '\0') {
    local_68.types_[0] = none_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    pcVar3 = "the commissioner is not active";
    local_68.context_.types_ = local_68.types_;
    do {
      pcVar4 = pcVar3 + 1;
      if (*pcVar3 == '}') {
        if ((pcVar4 == "") || (*pcVar4 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar4 = pcVar3 + 2;
      }
      else if (*pcVar3 == '{') {
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar3,"",&local_68);
      }
      pcVar3 = pcVar4;
    } while (pcVar4 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_e0,(v10 *)0x249d58,(string_view)ZEXT816(0x1e),args);
    local_b0 = kInvalidState;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    __return_storage_ptr__->mCode = local_b0;
  }
  else {
    if (((this->mActiveDataset).mPresentFlags & 0x1000) != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (aExtendedPanId,&(this->mActiveDataset).mExtendedPanId);
      goto LAB_001acd97;
    }
    local_68.types_[0] = none_type;
    pcVar3 = "cannot find valid Extended PAN ID in Active Operational Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "cannot find valid Extended PAN ID in Active Operational Dataset";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x3f;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_b8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_b8,pcVar3,"");
          goto LAB_001acd16;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001acd16:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_e0,(v10 *)"cannot find valid Extended PAN ID in Active Operational Dataset",
               (string_view)ZEXT816(0x3f),args_00);
    local_b0 = kNotFound;
    local_a8[0] = local_98;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a8,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
    __return_storage_ptr__->mCode = local_b0;
  }
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_a8);
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
LAB_001acd97:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetExtendedPanId(ByteArray &aExtendedPanId) const
{
    Error       error;
    std::string extendedPanIdString;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    VerifyOrExit(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kExtendedPanIdBit,
                 error = ERROR_NOT_FOUND("cannot find valid Extended PAN ID in Active Operational Dataset"));
    aExtendedPanId = mActiveDataset.mExtendedPanId;

exit:
    return error;
}